

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<std::__cxx11::string&>
          (String *__return_storage_ptr__,kj *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params)

{
  ArrayPtr<const_char> local_18;
  
  local_18 = toCharSequence<std::__cxx11::string&>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  _::concat<kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_18,(ArrayPtr<const_char> *)local_18.size_);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}